

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  size_t __size;
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  char *key;
  char *langtag;
  char *transkey;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t allocsize;
  ucvector local_58;
  LodePNGInfo *local_40;
  LodePNGDecompressSettings *local_38;
  
  local_58.data = (uchar *)0x0;
  local_58.size = 0;
  local_58.allocsize = 0;
  if (chunkLength < 5) {
    uVar7 = 0x1e;
  }
  else {
    uVar7 = 1;
    uVar5 = 0;
    do {
      if (data[uVar5] == '\0') break;
      uVar5 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar5 < chunkLength);
    uVar8 = uVar7 - 1;
    uVar9 = uVar7 + 2;
    uVar6 = (ulong)uVar9;
    if (uVar6 < chunkLength) {
      if (0xffffffb0 < uVar7 - 0x51) {
        __size = (ulong)uVar8 + 1;
        local_40 = info;
        local_38 = zlibsettings;
        key = (char *)malloc(__size);
        if (key == (char *)0x0) {
          key = (char *)0x0;
          langtag = (char *)0x0;
          transkey = (char *)0x0;
        }
        else {
          key[uVar5] = '\0';
          memcpy(key,data,(ulong)uVar8);
          transkey = (char *)0x0;
          if (data[uVar5 + 2] != '\0') {
            uVar7 = 0x48;
            langtag = (char *)0x0;
            goto LAB_001114a1;
          }
          uVar1 = data[__size];
          do {
            if (data[uVar6] == '\0') break;
            uVar6 = (ulong)(uVar7 + 3 + (int)transkey);
            transkey = (char *)(ulong)((int)transkey + 1);
          } while (uVar6 < chunkLength);
          iVar2 = (int)transkey;
          langtag = (char *)malloc((ulong)(iVar2 + 1U));
          if (langtag == (char *)0x0) {
            langtag = (char *)0x0;
          }
          else {
            langtag[(long)transkey] = '\0';
            if (iVar2 != 0) {
              pcVar4 = (char *)0x0;
              do {
                langtag[(long)pcVar4] = data[(int)pcVar4 + uVar9];
                pcVar4 = pcVar4 + 1;
              } while (transkey != pcVar4);
            }
            uVar9 = iVar2 + 1U + uVar9;
            uVar5 = (ulong)uVar9;
            uVar7 = 0;
            if (uVar5 < chunkLength) {
              uVar7 = 0;
              do {
                if (data[uVar5] == '\0') break;
                uVar5 = (ulong)(iVar2 + uVar8 + 5 + uVar7);
                uVar7 = uVar7 + 1;
              } while (uVar5 < chunkLength);
            }
            transkey = (char *)malloc((ulong)(uVar7 + 1));
            if (transkey != (char *)0x0) {
              transkey[uVar7] = '\0';
              if (uVar7 != 0) {
                uVar5 = 0;
                do {
                  transkey[uVar5] = data[uVar9 + (int)uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar7 != uVar5);
              }
              uVar9 = uVar7 + 1 + uVar9;
              uVar6 = (ulong)uVar9;
              uVar5 = 0;
              if (uVar6 <= chunkLength) {
                uVar5 = chunkLength - uVar6;
              }
              if (uVar1 == '\0') {
                uVar6 = (ulong)((int)uVar5 + 1);
                uVar7 = ucvector_reserve(&local_58,uVar6);
                if (uVar7 == 0) goto LAB_0011164e;
                local_58.data[uVar5 & 0xffffffff] = '\0';
                local_58.size = uVar6;
                if ((uVar5 & 0xffffffff) != 0) {
                  uVar6 = 0;
                  do {
                    local_58.data[uVar6] = data[(int)uVar6 + uVar9];
                    uVar6 = uVar6 + 1;
                  } while ((uVar5 & 0xffffffff) != uVar6);
                }
              }
              else {
                uVar7 = zlib_decompress(&local_58.data,&local_58.size,data + uVar6,
                                        uVar5 & 0xffffffff,local_38);
                sVar3 = local_58.size;
                if (uVar7 != 0) goto LAB_001114a1;
                if (local_58.allocsize < local_58.size) {
                  local_58.allocsize = local_58.size;
                }
                allocsize = local_58.size + 1;
                uVar7 = ucvector_reserve(&local_58,allocsize);
                if (uVar7 != 0) {
                  local_58.data[sVar3] = '\0';
                  local_58.size = allocsize;
                }
              }
              uVar7 = lodepng_add_itext(local_40,key,langtag,transkey,(char *)local_58.data);
              goto LAB_001114a1;
            }
          }
          transkey = (char *)0x0;
        }
LAB_0011164e:
        uVar7 = 0x53;
        goto LAB_001114a1;
      }
      uVar7 = 0x59;
    }
    else {
      uVar7 = 0x4b;
    }
  }
  key = (char *)0x0;
  langtag = (char *)0x0;
  transkey = (char *)0x0;
LAB_001114a1:
  free(key);
  free(langtag);
  free(transkey);
  local_58.size = 0;
  local_58.allocsize = 0;
  free(local_58.data);
  return uVar7;
}

Assistant:

static void ucvector_init(ucvector* p)
{
  p->data = NULL;
  p->size = p->allocsize = 0;
}